

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printSrcIdx(MCInst *MI,uint Op,SStream *O)

{
  uint uVar1;
  uint8_t *puVar2;
  SStream *O_00;
  undefined8 in_RDX;
  int in_ESI;
  MCInst *in_RDI;
  SStream *unaff_retaddr;
  uint in_stack_0000000c;
  uint8_t access [6];
  int reg;
  MCOperand *SegReg;
  cs_struct *in_stack_ffffffffffffffc8;
  SStream *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t *in_stack_ffffffffffffffe0;
  uint id;
  undefined4 in_stack_fffffffffffffff0;
  
  id = (uint)((ulong)in_RDX >> 0x20);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar2 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x55;
    puVar2[0] = '\x03';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] = in_RDI->x86opsize;
    puVar2 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x61;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x65;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x69;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x6d;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    in_stack_ffffffffffffffc8 = in_RDI->csh;
    MCInst_getOpcode(in_RDI);
    get_op_access((cs_struct *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),id,
                  in_stack_ffffffffffffffe0,
                  (uint64_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x76] =
         (&stack0xffffffffffffffd6)[(in_RDI->flat_insn->detail->field_6).x86.op_count];
  }
  O_00 = (SStream *)MCInst_getOperand(in_RDI,in_ESI + 1);
  uVar1 = MCOperand_getReg((MCOperand *)O_00);
  if (uVar1 != 0) {
    _printOperand((MCInst *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),id,O_00);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d) = uVar1;
    }
    SStream_concat0(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  }
  SStream_concat0(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  set_mem_access(in_RDI,true);
  printOperand(stack0x00000010,in_stack_0000000c,unaff_retaddr);
  SStream_concat0(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  set_mem_access(in_RDI,false);
  return;
}

Assistant:

static void printSrcIdx(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *SegReg;
	int reg;

	if (MI->csh->detail) {
		uint8_t access[6];

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;

		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
	}

	SegReg = MCInst_getOperand(MI, Op+1);
	reg = MCOperand_getReg(SegReg);

	// If this has a segment register, print it.
	if (reg) {
		_printOperand(MI, Op+1, O);
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = reg;
		}

		SStream_concat0(O, ":");
	}

	SStream_concat0(O, "(");
	set_mem_access(MI, true);

	printOperand(MI, Op, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}